

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *tgtInfo,bool verbose,bool color)

{
  bool bVar1;
  cmake *this_00;
  ostream *poVar2;
  string *psVar3;
  char *message_00;
  allocator<char> local_a41;
  string local_a40 [8];
  string message;
  undefined1 local_a00 [8];
  string targetName;
  cmDependsC checker;
  undefined1 local_468 [7];
  bool needRescanDependencies;
  DependencyMap validDependencies;
  undefined1 local_418 [8];
  ostringstream msg_1;
  int local_29c;
  undefined1 local_298 [4];
  int result_1;
  string dirInfoFile;
  undefined1 local_270 [7];
  bool needRescanDirInfo;
  undefined1 local_250 [8];
  ostringstream msg;
  int local_d4;
  cmFileTimeCache *pcStack_d0;
  int result;
  cmFileTimeCache *ftc;
  undefined1 local_c0 [7];
  bool needRescanDependInfo;
  string dependFile;
  string internalDependFile;
  string targetDir;
  allocator<char> local_49;
  string local_48;
  byte local_22;
  byte local_21;
  bool color_local;
  string *psStack_20;
  bool verbose_local;
  string *tgtInfo_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  local_22 = color;
  local_21 = verbose;
  psStack_20 = tgtInfo;
  tgtInfo_local = (string *)this;
  bVar1 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((!bVar1) || (bVar1 = cmSystemTools::GetErrorOccuredFlag(), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Target DependInfo.cmake file not found",&local_49);
    cmSystemTools::Error(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  CheckMultipleOutputs(this,(bool)(local_21 & 1));
  psVar3 = (string *)((long)&internalDependFile.field_2 + 8);
  cmsys::SystemTools::GetFilenamePath(psVar3,psStack_20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&dependFile.field_2 + 8),psVar3,"/depend.internal");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&internalDependFile.field_2 + 8),"/depend.make");
  ftc._7_1_ = 0;
  this_00 = cmGlobalGenerator::GetCMakeInstance
                      ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator);
  pcStack_d0 = cmake::GetFileTimeCache(this_00);
  bVar1 = cmFileTimeCache::Compare
                    (pcStack_d0,(string *)((long)&dependFile.field_2 + 8),psStack_20,&local_d4);
  if ((!bVar1) || (local_d4 < 0)) {
    if ((local_21 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
      poVar2 = std::operator<<((ostream *)local_250,"Dependee \"");
      poVar2 = std::operator<<(poVar2,(string *)psStack_20);
      poVar2 = std::operator<<(poVar2,"\" is newer than depender \"");
      poVar2 = std::operator<<(poVar2,(string *)(dependFile.field_2._M_local_buf + 8));
      poVar2 = std::operator<<(poVar2,"\".");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      cmSystemTools::Stdout((string *)local_270);
      std::__cxx11::string::~string((string *)local_270);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
    }
    ftc._7_1_ = 1;
  }
  dirInfoFile.field_2._M_local_buf[0xf] = '\0';
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)local_298,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)local_298,"/CMakeFiles");
  std::__cxx11::string::operator+=((string *)local_298,"/CMakeDirectoryInformation.cmake");
  bVar1 = cmFileTimeCache::Compare
                    (pcStack_d0,(string *)((long)&dependFile.field_2 + 8),(string *)local_298,
                     &local_29c);
  if ((!bVar1) || (local_29c < 0)) {
    if ((local_21 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
      poVar2 = std::operator<<((ostream *)local_418,"Dependee \"");
      poVar2 = std::operator<<(poVar2,(string *)local_298);
      poVar2 = std::operator<<(poVar2,"\" is newer than depender \"");
      poVar2 = std::operator<<(poVar2,(string *)(dependFile.field_2._M_local_buf + 8));
      poVar2 = std::operator<<(poVar2,"\".");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      cmSystemTools::Stdout
                ((string *)&validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string
                ((string *)&validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
    }
    dirInfoFile.field_2._M_local_buf[0xf] = '\x01';
  }
  std::__cxx11::string::~string((string *)local_298);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)local_468);
  checker.CacheFileName.field_2._M_local_buf[0xf] = '\0';
  if ((dirInfoFile.field_2._M_local_buf[0xf] & 1U) == 0) {
    cmDependsC::cmDependsC((cmDependsC *)((long)&targetName.field_2 + 8));
    cmDepends::SetVerbose((cmDepends *)((long)&targetName.field_2 + 8),(bool)(local_21 & 1));
    cmDepends::SetFileTimeCache((cmDepends *)((long)&targetName.field_2 + 8),pcStack_d0);
    bVar1 = cmDepends::Check((cmDepends *)((long)&targetName.field_2 + 8),(string *)local_c0,
                             (string *)((long)&dependFile.field_2 + 8),(DependencyMap *)local_468);
    checker.CacheFileName.field_2._M_local_buf[0xf] = (bVar1 ^ 0xffU) & 1;
    cmDependsC::~cmDependsC((cmDependsC *)((long)&targetName.field_2 + 8));
  }
  if ((((ftc._7_1_ & 1) == 0) && ((dirInfoFile.field_2._M_local_buf[0xf] & 1U) == 0)) &&
     (checker.CacheFileName.field_2._M_local_buf[0xf] == '\0')) {
    this_local._7_1_ = 1;
  }
  else {
    cmsys::SystemTools::GetFilenameName
              ((string *)local_a00,(string *)((long)&internalDependFile.field_2 + 8));
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)((long)&message.field_2 + 8),(ulong)local_a00);
    std::__cxx11::string::operator=
              ((string *)local_a00,(string *)(message.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_a40,"Scanning dependencies of target ",&local_a41);
    std::allocator<char>::~allocator(&local_a41);
    std::__cxx11::string::operator+=(local_a40,(string *)local_a00);
    message_00 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::MakefileColorEcho(0x106,message_00,true,(bool)(local_22 & 1));
    this_local._7_1_ =
         ScanDependencies(this,(string *)((long)&internalDependFile.field_2 + 8),(string *)local_c0,
                          (string *)((long)&dependFile.field_2 + 8),(DependencyMap *)local_468);
    std::__cxx11::string::~string(local_a40);
    std::__cxx11::string::~string((string *)local_a00);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *)local_468);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)(dependFile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(internalDependFile.field_2._M_local_buf + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(
  const std::string& tgtInfo, bool verbose, bool color)
{
  // read in the target info file
  if (!this->Makefile->ReadListFile(tgtInfo) ||
      cmSystemTools::GetErrorOccuredFlag()) {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
  }

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string const targetDir = cmSystemTools::GetFilenamePath(tgtInfo);
  std::string const internalDependFile = targetDir + "/depend.internal";
  std::string const dependFile = targetDir + "/depend.make";

  // If the target DependInfo.cmake file has changed since the last
  // time dependencies were scanned then force rescanning.  This may
  // happen when a new source file is added and CMake regenerates the
  // project but no other sources were touched.
  bool needRescanDependInfo = false;
  cmFileTimeCache* ftc =
    this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache();
  {
    int result;
    if (!ftc->Compare(internalDependFile, tgtInfo, &result) || result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << tgtInfo << "\" is newer than depender \""
            << internalDependFile << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
      needRescanDependInfo = true;
    }
  }

  // If the directory information is newer than depend.internal, include dirs
  // may have changed. In this case discard all old dependencies.
  bool needRescanDirInfo = false;
  {
    std::string dirInfoFile = this->GetCurrentBinaryDirectory();
    dirInfoFile += "/CMakeFiles";
    dirInfoFile += "/CMakeDirectoryInformation.cmake";
    int result;
    if (!ftc->Compare(internalDependFile, dirInfoFile, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << dirInfoFile << "\" is newer than depender \""
            << internalDependFile << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
      needRescanDirInfo = true;
    }
  }

  // Check the implicit dependencies to see if they are up to date.
  // The build.make file may have explicit dependencies for the object
  // files but these will not affect the scanning process so they need
  // not be considered.
  cmDepends::DependencyMap validDependencies;
  bool needRescanDependencies = false;
  if (!needRescanDirInfo) {
    cmDependsC checker;
    checker.SetVerbose(verbose);
    checker.SetFileTimeCache(ftc);
    // cmDependsC::Check() fills the vector validDependencies() with the
    // dependencies for those files where they are still valid, i.e. neither
    // the files themselves nor any files they depend on have changed.
    // We don't do that if the CMakeDirectoryInformation.cmake file has
    // changed, because then potentially all dependencies have changed.
    // This information is given later on to cmDependsC, which then only
    // rescans the files where it did not get valid dependencies via this
    // dependency vector. This means that in the normal case, when only
    // few or one file have been edited, then also only this one file is
    // actually scanned again, instead of all files for this target.
    needRescanDependencies =
      !checker.Check(dependFile, internalDependFile, validDependencies);
  }

  if (needRescanDependInfo || needRescanDirInfo || needRescanDependencies) {
    // The dependencies must be regenerated.
    std::string targetName = cmSystemTools::GetFilenameName(targetDir);
    targetName = targetName.substr(0, targetName.length() - 4);
    std::string message = "Scanning dependencies of target ";
    message += targetName;
    cmSystemTools::MakefileColorEcho(cmsysTerminal_Color_ForegroundMagenta |
                                       cmsysTerminal_Color_ForegroundBold,
                                     message.c_str(), true, color);

    return this->ScanDependencies(targetDir, dependFile, internalDependFile,
                                  validDependencies);
  }

  // The dependencies are already up-to-date.
  return true;
}